

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void __thiscall
duckdb::BitpackingCompressionState<unsigned_long,_true,_long>::FlushSegment
          (BitpackingCompressionState<unsigned_long,_true,_long> *this)

{
  long *plVar1;
  BlockManager *pBVar2;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> _Var3;
  bool bVar4;
  unsigned_long uVar5;
  idx_t iVar6;
  idx_t iVar7;
  unsigned_long __n;
  InternalException *this_00;
  ulong uVar8;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_80;
  BufferHandle *local_78;
  ColumnCheckpointState *local_70;
  BufferHandle local_68;
  string local_50;
  
  local_70 = ColumnDataCheckpointData::GetCheckpointState(this->checkpoint_data);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  plVar1 = (long *)((this->handle).node.ptr)->buffer;
  uVar5 = NumericCastImpl<unsigned_long,_long,_false>::Convert((long)this->data_ptr - (long)plVar1);
  pBVar2 = (this->super_CompressionState).info.block_manager;
  iVar6 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
  iVar7 = optional_idx::GetIndex(&pBVar2->block_header_size);
  __n = NumericCastImpl<unsigned_long,_long,_false>::Convert
                  ((long)((long)plVar1 + ((iVar6 - iVar7) - (long)this->metadata_ptr)));
  bVar4 = CanStore(this,0,0);
  if (bVar4) {
    local_78 = &this->handle;
    uVar8 = uVar5 + 7 & 0xfffffffffffffff8;
    if (uVar8 - uVar5 != 0) {
      switchD_012e5a64::default((data_ptr_t)(uVar5 + (long)plVar1),0,uVar8 - uVar5);
    }
    memmove((data_ptr_t)(uVar8 + (long)plVar1),this->metadata_ptr,__n);
    *plVar1 = __n + uVar8;
    local_80._M_head_impl =
         (this->current_segment).
         super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
         super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
         .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
    (this->current_segment).
    super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
    super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
    super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
    BufferHandle::BufferHandle(&local_68,local_78);
    (*local_70->_vptr_ColumnCheckpointState[4])(local_70,&local_80,&local_68,__n + uVar8);
    BufferHandle::~BufferHandle(&local_68);
    _Var3._M_head_impl = local_80._M_head_impl;
    if (local_80._M_head_impl != (ColumnSegment *)0x0) {
      ColumnSegment::~ColumnSegment(local_80._M_head_impl);
      operator_delete(_Var3._M_head_impl);
    }
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Error in bitpacking size calculation","");
  InternalException::InternalException(this_00,&local_50);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void FlushSegment() {
		auto &state = checkpoint_data.GetCheckpointState();
		auto base_ptr = handle.Ptr();

		// Compact the segment by moving the metadata next to the data.

		idx_t unaligned_offset = NumericCast<idx_t>(data_ptr - base_ptr);
		idx_t metadata_offset = AlignValue(unaligned_offset);
		idx_t metadata_size = NumericCast<idx_t>(base_ptr + info.GetBlockSize() - metadata_ptr);
		idx_t total_segment_size = metadata_offset + metadata_size;

		// Asserting things are still sane here
		if (!CanStore(0, 0)) {
			throw InternalException("Error in bitpacking size calculation");
		}

		if (unaligned_offset != metadata_offset) {
			// zero initialize any padding bits
			memset(base_ptr + unaligned_offset, 0, metadata_offset - unaligned_offset);
		}
		memmove(base_ptr + metadata_offset, metadata_ptr, metadata_size);

		// Store the offset of the metadata of the first group (which is at the highest address).
		Store<idx_t>(metadata_offset + metadata_size, base_ptr);

		state.FlushSegment(std::move(current_segment), std::move(handle), total_segment_size);
	}